

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# Parser.h
# Opt level: O0

void __thiscall
Parser::printError<std::__cxx11::string>
          (Parser *this,Token *token,char *text,
          basic_string<char,_std::char_traits<char>,_std::allocator<char>_> *args)

{
  string local_48;
  basic_string<char,_std::char_traits<char>,_std::allocator<char>_> *local_28;
  basic_string<char,_std::char_traits<char>,_std::allocator<char>_> *args_local;
  char *text_local;
  Token *token_local;
  Parser *this_local;
  
  local_28 = args;
  args_local = (basic_string<char,_std::char_traits<char>,_std::allocator<char>_> *)text;
  text_local = (char *)token;
  token_local = (Token *)this;
  tinyformat::format<std::__cxx11::string>(&local_48,(tinyformat *)text,(char *)args,args);
  printError(this,token,&local_48);
  std::__cxx11::string::~string((string *)&local_48);
  return;
}

Assistant:

void printError(const Token& token, const char* text, const Args&... args)
	{
		printError(token, tfm::format(text,args...));
	}